

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O0

sexp_conflict sexp_current_clock_second(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  timezone tz;
  timeval tv;
  timezone tStack_38;
  timeval local_30;
  undefined8 local_18;
  undefined8 local_10;
  sexp_conflict local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = gettimeofday(&local_30,&tStack_38);
  if (iVar1 == 0) {
    local_8 = (sexp_conflict)
              sexp_make_flonum((double)local_30.tv_sec + (double)local_30.tv_usec / 1000000.0,
                               local_10);
  }
  else {
    local_8 = (sexp_conflict)sexp_user_exception(local_10,local_18,"couldn\'t gettimeofday",0x3e);
  }
  return local_8;
}

Assistant:

sexp sexp_current_clock_second (sexp ctx, sexp self, sexp_sint_t n) {
#ifdef _WIN32
  ULONGLONG t;
  SYSTEMTIME st;
  FILETIME ft;
  ULARGE_INTEGER uli;
  GetLocalTime(&st);
  (void) SystemTimeToFileTime(&st, &ft);
  /* Convert Win32 FILETIME to UNIX time */
  uli.LowPart = ft.dwLowDateTime;
  uli.HighPart = ft.dwHighDateTime;
  t = uli.QuadPart - (11644473600LL * 10 * 1000 * 1000);
  return sexp_make_flonum(ctx, ((double)t / (10 * 1000 * 1000)));
#elif !defined(PLAN9)
  struct timeval tv;
  struct timezone tz;
  if (gettimeofday(&tv, &tz))
    return sexp_user_exception(ctx, self, "couldn't gettimeofday", SEXP_FALSE);
  return sexp_make_flonum(ctx, tv.tv_sec + tv.tv_usec / 1000000.0);
#else
  time_t res = time(NULL);
  return sexp_make_flonum(ctx, res);
#endif
}